

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test.cc
# Opt level: O2

void xLearn::read_from_disk(string *filename,int task_id)

{
  bool has_label;
  index_t iVar1;
  DMatrix *this;
  uint uVar2;
  DMatrix *matrix;
  OndiskReader reader;
  
  OndiskReader::OndiskReader(&reader);
  reader.super_Reader.block_size_ = 100;
  OndiskReader::Initialize(&reader,filename);
  this = (DMatrix *)operator_new(0x68);
  DMatrix::DMatrix(this);
  uVar2 = 0;
  matrix = this;
  do {
    while( true ) {
      if (9 < uVar2) {
        OndiskReader::~OndiskReader(&reader);
        return;
      }
      iVar1 = OndiskReader::Samples(&reader,&matrix);
      if (iVar1 != 0) break;
      OndiskReader::Reset(&reader);
    }
    has_label = true;
    switch(task_id) {
    case 2:
      CheckCSV(matrix,true);
      break;
    case 3:
      has_label = false;
    case 0:
      CheckLR(matrix,has_label,true);
      break;
    case 4:
      has_label = false;
    case 1:
      CheckFFM(matrix,has_label,true);
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void read_from_disk(const std::string& filename, int task_id) {
  OndiskReader reader;
  reader.SetBlockSize(100);
  reader.Initialize(filename);
  DMatrix* matrix = new DMatrix;
  for (int i = 0; i < iteration_num; ++i) {
    int record_num = reader.Samples(matrix);
    if (record_num == 0) {
      --i;
      reader.Reset();
      continue;
    }
    switch(task_id) {
      case 0:
        CheckLR(matrix, true, true);
        break;
      case 1:
        CheckFFM(matrix, true, true);
        break;
      case 2:
        CheckCSV(matrix, true);
        break;
      case 3:
        CheckLR(matrix, false, true);
        break;
      case 4:
        CheckFFM(matrix, false, true);
        break;
    }
  } 
}